

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O0

RenderPassWrapper * __thiscall
VulkanUtilities::VulkanLogicalDevice::CreateRenderPass
          (RenderPassWrapper *__return_storage_ptr__,VulkanLogicalDevice *this,
          VkRenderPassCreateInfo2 *RenderPassCI,char *DebugName)

{
  Char *pCVar1;
  ExtensionFeatures *pEVar2;
  undefined1 local_78 [8];
  string msg_1;
  undefined1 local_48 [8];
  string msg;
  char *DebugName_local;
  VkRenderPassCreateInfo2 *RenderPassCI_local;
  VulkanLogicalDevice *this_local;
  
  msg.field_2._8_8_ = DebugName;
  if (RenderPassCI->sType != VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO_2) {
    Diligent::FormatString<char[26],char[66]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"RenderPassCI.sType == VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO_2",
               (char (*) [66])DebugName);
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugName = (char *)0xed;
    Diligent::DebugAssertionFailed
              (pCVar1,"CreateRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0xed);
    std::__cxx11::string::~string((string *)local_48);
  }
  pEVar2 = GetEnabledExtFeatures(this);
  if ((pEVar2->RenderPass2 & 1U) == 0) {
    Diligent::FormatString<char[26],char[48]>
              ((string *)local_78,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"GetEnabledExtFeatures().RenderPass2 != VK_FALSE",
               (char (*) [48])DebugName);
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar1,"CreateRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0xee);
    std::__cxx11::string::~string((string *)local_78);
  }
  CreateVulkanObject<VkRenderPass_T*,(VulkanUtilities::VulkanHandleTypeId)8,VkResult(*)(VkDevice_T*,VkRenderPassCreateInfo2_const*,VkAllocationCallbacks_const*,VkRenderPass_T**),VkRenderPassCreateInfo2>
            (__return_storage_ptr__,this,
             (_func_VkResult_VkDevice_T_ptr_VkRenderPassCreateInfo2_ptr_VkAllocationCallbacks_ptr_VkRenderPass_T_ptr_ptr
              *)vkCreateRenderPass2KHR,RenderPassCI,(char *)msg.field_2._8_8_,"render pass 2");
  return __return_storage_ptr__;
}

Assistant:

RenderPassWrapper VulkanLogicalDevice::CreateRenderPass(const VkRenderPassCreateInfo2& RenderPassCI, const char* DebugName) const
{
#if DILIGENT_USE_VOLK
    VERIFY_EXPR(RenderPassCI.sType == VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO_2);
    VERIFY_EXPR(GetEnabledExtFeatures().RenderPass2 != VK_FALSE);
    return CreateVulkanObject<VkRenderPass, VulkanHandleTypeId::RenderPass>(vkCreateRenderPass2KHR, RenderPassCI, DebugName, "render pass 2");
#else
    UNSUPPORTED("vkCreateRenderPass2KHR is only available through Volk");
    return RenderPassWrapper{};
#endif
}